

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

Qiniu_Error Qiniu_Client_Call(Qiniu_Client *self,Qiniu_Json **ret,char *url)

{
  uint uVar1;
  CURL *curl;
  undefined8 uVar2;
  char *pcVar3;
  size_t in_R9;
  Qiniu_Error QVar4;
  Qiniu_Header *headers;
  undefined8 local_38;
  
  local_38 = 0;
  curl = Qiniu_Client_initcall(self,url);
  QVar4 = Qiniu_Client_config(self);
  if (QVar4.code == 200) {
    if ((self->auth).itbl == (Qiniu_Auth_Itbl *)0x0) {
      uVar2 = 0;
    }
    else {
      QVar4 = Qiniu_Do_Auth(self,(char *)&local_38,(Qiniu_Header **)url,(char *)0x0,(char *)0x0,
                            in_R9);
      uVar2 = local_38;
      if (QVar4.code != 200) goto LAB_0011fd55;
    }
    curl_easy_setopt(curl,0x2727,uVar2);
    QVar4 = Qiniu_callex(curl,&self->b,&self->root,0,&self->respHeader);
    pcVar3 = QVar4.message;
    uVar1 = QVar4.code;
    curl_slist_free_all(local_38);
    *ret = self->root;
  }
  else {
LAB_0011fd55:
    pcVar3 = QVar4.message;
    uVar1 = QVar4.code;
  }
  QVar4._4_4_ = 0;
  QVar4.code = uVar1;
  QVar4.message = pcVar3;
  return QVar4;
}

Assistant:

Qiniu_Error Qiniu_Client_Call(Qiniu_Client *self, Qiniu_Json **ret, const char *url)
{
    Qiniu_Error err;
    Qiniu_Header *headers = NULL;
    CURL *curl = Qiniu_Client_initcall(self, url);
    err = Qiniu_Client_config(self);
    if (err.code != 200)
    {
        return err;
    }

    if (self->auth.itbl != NULL)
    {
        err = Qiniu_Do_Auth(self, "POST", &headers, url, NULL, 0);
        if (err.code != 200)
        {
            return err;
        }
    }

    curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

    err = Qiniu_callex(curl, &self->b, &self->root, Qiniu_False, &self->respHeader);
    curl_slist_free_all(headers);
    *ret = self->root;
    return err;
}